

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

int __thiscall mpt::layout::graph::transform3::dimensions(transform3 *this)

{
  float fVar1;
  transform3 *this_local;
  
  fVar1 = this->_dim[2].super_value_apply.to.super_point<float>.x;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) ||
      (fVar1 = this->_dim[2].super_value_apply.to.super_point<float>.y, fVar1 != 0.0)) ||
     (NAN(fVar1))) {
    this_local._4_4_ = 3;
  }
  else {
    fVar1 = this->_dim[1].super_value_apply.to.super_point<float>.x;
    if (((fVar1 != 0.0) || (NAN(fVar1))) ||
       ((fVar1 = this->_dim[1].super_value_apply.to.super_point<float>.y, fVar1 != 0.0 ||
        (NAN(fVar1))))) {
      this_local._4_4_ = 2;
    }
    else {
      fVar1 = this->_dim[0].super_value_apply.to.super_point<float>.x;
      if (((fVar1 != 0.0) || (NAN(fVar1))) ||
         ((fVar1 = this->_dim[0].super_value_apply.to.super_point<float>.y, fVar1 != 0.0 ||
          (NAN(fVar1))))) {
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int layout::graph::transform3::dimensions() const
{
	if (_dim[2].to.x || _dim[2].to.y) {
		return 3;
	}
	if (_dim[1].to.x || _dim[1].to.y) {
		return 2;
	}
	if (_dim[0].to.x || _dim[0].to.y) {
		return 1;
	}
	return 0;
}